

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaReal __thiscall NaVector::distance(NaVector *this,NaVector *that)

{
  uint uVar1;
  long in_RSI;
  long *in_RDI;
  double dVar2;
  NaReal vTmp;
  NaReal vDist;
  uint i;
  double local_20;
  uint local_14;
  
  local_20 = 0.0;
  local_14 = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar1 <= local_14) break;
    dVar2 = *(double *)(in_RDI[2] + (ulong)local_14 * 8) -
            *(double *)(*(long *)(in_RSI + 0x10) + (ulong)local_14 * 8);
    local_20 = dVar2 * dVar2 + local_20;
    local_14 = local_14 + 1;
  }
  dVar2 = sqrt(local_20);
  return dVar2;
}

Assistant:

NaReal
NaVector::distance (const NaVector& that) const
{
    unsigned    i;
    NaReal      vDist = 0.0;
    NaReal      vTmp;
    for(i = 0; i < dim(); ++i){
        vTmp = pVect[i] - that.pVect[i];
        vDist += vTmp * vTmp;
    }
    return sqrt(vDist);
}